

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

void __thiscall
duckdb::QuantileSortTree::QuantileSortTree
          (QuantileSortTree *this,AggregateInputData *aggr_input_data,
          WindowPartitionInput *partition)

{
  ulong uVar1;
  FunctionData FVar2;
  FunctionData *pFVar3;
  ClientContext *pCVar4;
  _Tuple_impl<0UL,_duckdb::WindowIndexTree_*,_std::default_delete<duckdb::WindowIndexTree>_> _Var5;
  long *plVar6;
  long lVar7;
  long lVar8;
  WindowPartitionInput *pWVar9;
  long lVar10;
  char cVar11;
  reference pvVar12;
  BoundConstantExpression *pBVar13;
  _Tuple_impl<0UL,_duckdb::WindowIndexTree_*,_std::default_delete<duckdb::WindowIndexTree>_> this_00
  ;
  pointer pWVar14;
  pointer pWVar15;
  reference vector;
  InternalException *this_01;
  pointer *__ptr;
  ulong uVar16;
  long lVar17;
  unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>,_true>
  index_state;
  vector<unsigned_long,_true> sort_idx;
  SelectionVector filter_sel;
  BoundOrderModifier order_bys;
  DataChunk sort;
  ColumnDataScanState scan;
  _Head_base<0UL,_duckdb::WindowAggregatorState_*,_false> local_1f8;
  BoundConstantExpression *local_1f0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1e8;
  ColumnDataScanState *local_1c8;
  WindowPartitionInput *local_1c0;
  string local_1b8 [2];
  SelectionVector local_178;
  LogicalType local_160 [24];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_148;
  BoundOrderModifier local_130;
  vector<duckdb::Vector,_true> local_f0;
  ulong local_d8;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_b0;
  undefined1 local_78;
  long local_60;
  void *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  (this->index_tree).
  super_unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>_>._M_t.
  super___uniq_ptr_impl<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::WindowIndexTree_*,_std::default_delete<duckdb::WindowIndexTree>_>.
  super__Head_base<0UL,_duckdb::WindowIndexTree_*,_false> =
       (_Head_base<0UL,_duckdb::WindowIndexTree_*,_false>)0x0;
  local_1c8 = *(ColumnDataScanState **)(partition + 8);
  local_b0._M_buckets = &local_b0._M_single_bucket;
  local_b0._M_bucket_count = 1;
  local_b0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b0._M_element_count = 0;
  local_b0._M_rehash_policy._M_max_load_factor = 1.0;
  local_b0._M_rehash_policy._M_next_resize = 0;
  local_b0._M_single_bucket = (__node_base_ptr)0x0;
  local_78 = 0;
  local_48 = (void *)0x0;
  uStack_40 = 0;
  local_38 = 0;
  duckdb::DataChunk::DataChunk((DataChunk *)&local_f0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_148,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)(partition + 0x18))
  ;
  duckdb::ColumnDataCollection::InitializeScan(local_1c8,&local_b0,&local_148,1);
  if (local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_148.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  duckdb::ColumnDataCollection::InitializeScanChunk(local_1c8,(DataChunk *)&local_b0);
  local_1c0 = partition;
  optional_ptr<duckdb::FunctionData,_true>::CheckValid(&aggr_input_data->bind_data);
  pFVar3 = (aggr_input_data->bind_data).ptr;
  duckdb::DataChunk::GetTypes();
  pvVar12 = vector<duckdb::LogicalType,_true>::operator[]
                      ((vector<duckdb::LogicalType,_true> *)&local_1e8,0);
  duckdb::LogicalType::LogicalType(local_160,pvVar12);
  duckdb::Value::Value((Value *)local_1b8,local_160);
  pBVar13 = (BoundConstantExpression *)operator_new(0x98);
  duckdb::Value::Value((Value *)&local_130,(Value *)local_1b8);
  duckdb::BoundConstantExpression::BoundConstantExpression(pBVar13,(Value *)&local_130);
  duckdb::Value::~Value((Value *)&local_130);
  duckdb::Value::~Value((Value *)local_1b8);
  duckdb::LogicalType::~LogicalType(local_160);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_1e8);
  FVar2 = pFVar3[0x38];
  duckdb::BoundOrderModifier::BoundOrderModifier(&local_130);
  local_1f0 = pBVar13;
  duckdb::BoundOrderByNode::BoundOrderByNode((BoundOrderByNode *)local_1b8,(byte)FVar2 | 2,3);
  pWVar9 = local_1c0;
  std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::
  emplace_back<duckdb::BoundOrderByNode>
            ((vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> *)
             ((long)&local_130 + 0x10),(BoundOrderByNode *)local_1b8);
  if ((BaseStatistics *)local_1b8[0].field_2._0_8_ != (BaseStatistics *)0x0) {
    duckdb::BaseStatistics::~BaseStatistics((BaseStatistics *)local_1b8[0].field_2._0_8_);
    operator_delete((void *)local_1b8[0].field_2._0_8_);
  }
  local_1b8[0].field_2._M_allocated_capacity = 0;
  if ((long *)local_1b8[0]._M_string_length != (long *)0x0) {
    (**(code **)(*(long *)local_1b8[0]._M_string_length + 8))();
  }
  local_1b8[0]._M_string_length = 0;
  if (local_1f0 != (BoundConstantExpression *)0x0) {
    (**(code **)(*(long *)local_1f0 + 8))();
  }
  local_1f0 = (BoundConstantExpression *)0x0;
  local_1e8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1e8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)operator_new(8);
  local_1e8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_1e8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_start + 8;
  *(undefined8 *)
   local_1e8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  pCVar4 = *(ClientContext **)pWVar9;
  uVar16 = *(ulong *)(pWVar9 + 0x10);
  local_1e8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_1e8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  this_00.super__Head_base<0UL,_duckdb::WindowIndexTree_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::WindowIndexTree_*,_false>)operator_new(0xc0);
  duckdb::WindowIndexTree::WindowIndexTree
            ((WindowIndexTree *)
             this_00.super__Head_base<0UL,_duckdb::WindowIndexTree_*,_false>._M_head_impl,pCVar4,
             &local_130,(vector *)&local_1e8,uVar16);
  _Var5.super__Head_base<0UL,_duckdb::WindowIndexTree_*,_false>._M_head_impl =
       (this->index_tree).
       super_unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::WindowIndexTree_*,_std::default_delete<duckdb::WindowIndexTree>_>
       .super__Head_base<0UL,_duckdb::WindowIndexTree_*,_false>;
  (this->index_tree).
  super_unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>_>._M_t.
  super___uniq_ptr_impl<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::WindowIndexTree_*,_std::default_delete<duckdb::WindowIndexTree>_>.
  super__Head_base<0UL,_duckdb::WindowIndexTree_*,_false> =
       this_00.super__Head_base<0UL,_duckdb::WindowIndexTree_*,_false>._M_head_impl;
  if (_Var5.super__Head_base<0UL,_duckdb::WindowIndexTree_*,_false>._M_head_impl !=
      (WindowIndexTree *)0x0) {
    (**(code **)(*(long *)_Var5.super__Head_base<0UL,_duckdb::WindowIndexTree_*,_false>._M_head_impl
                + 8))();
  }
  pWVar14 = unique_ptr<duckdb::WindowIndexTree,_std::default_delete<duckdb::WindowIndexTree>,_true>
            ::operator->(&this->index_tree);
  (**(code **)(*(long *)pWVar14 + 0x10))(&local_1f8,pWVar14);
  pWVar15 = unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>,_true>
            ::operator->((unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>,_true>
                          *)&local_1f8);
  plVar6 = *(long **)(pWVar9 + 0x58);
  SelectionVector::SelectionVector(&local_178,0x800);
  do {
    while( true ) {
      cVar11 = duckdb::ColumnDataCollection::Scan(local_1c8,(DataChunk *)&local_b0);
      lVar10 = local_60;
      if (cVar11 == '\0') {
        duckdb::WindowMergeSortTreeLocalState::Sort();
        if (local_178.selection_data.internal.
            super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_178.selection_data.internal.
                     super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_1f8._M_head_impl != (WindowAggregatorState *)0x0) {
          (**(code **)(*(long *)local_1f8._M_head_impl + 8))();
        }
        if (local_1e8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1e8.
                          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        local_130._0_8_ = &PTR__BoundOrderModifier_008981d8;
        std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::~vector
                  ((vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> *)
                   ((long)&local_130 + 0x10));
        duckdb::BoundResultModifier::~BoundResultModifier(&local_130.super_BoundResultModifier);
        duckdb::DataChunk::~DataChunk((DataChunk *)&local_f0);
        if (local_48 != (void *)0x0) {
          operator_delete(local_48);
        }
        std::
        _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&local_b0);
        return;
      }
      if (*plVar6 == 0) break;
LAB_004e06be:
      vector = vector<duckdb::Vector,_true>::operator[](&local_f0,0);
      FlatVector::VerifyFlatVector(vector);
      if (local_d8 != 0) {
        lVar7 = *plVar6;
        lVar8 = *(long *)(vector + 0x28);
        uVar16 = 0;
        lVar17 = 0;
        do {
          if (((lVar7 == 0) ||
              (uVar1 = lVar10 + uVar16,
              (*(ulong *)(lVar7 + (uVar1 >> 6) * 8) >> (uVar1 & 0x3f) & 1) != 0)) &&
             ((lVar8 == 0 || ((*(ulong *)(lVar8 + (uVar16 >> 6) * 8) >> (uVar16 & 0x3f) & 1) != 0)))
             ) {
            local_178.sel_vector[lVar17] = (sel_t)uVar16;
            lVar17 = lVar17 + 1;
          }
          uVar16 = uVar16 + 1;
        } while ((uVar16 & 0xffffffff) < local_d8);
      }
      duckdb::WindowMergeSortTreeLocalState::SinkChunk(pWVar15,&local_f0,lVar10,&local_178);
    }
    if ((*(long *)(local_1c0 + 0x40) - (long)*(byte **)(local_1c0 + 0x30)) * 8 +
        (ulong)*(uint *)(local_1c0 + 0x48) == 0) {
      this_01 = (InternalException *)__cxa_allocate_exception(0x10);
      local_1b8[0]._M_dataplus._M_p = (pointer)&local_1b8[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,"Attempted to access index %ld within vector of size %ld","");
      InternalException::InternalException<unsigned_long,unsigned_long>(this_01,local_1b8,0,0);
      __cxa_throw(this_01,&InternalException::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((**(byte **)(local_1c0 + 0x30) & 1) == 0) goto LAB_004e06be;
    duckdb::WindowMergeSortTreeLocalState::SinkChunk(pWVar15,&local_f0,local_60,0);
  } while( true );
}

Assistant:

QuantileSortTree(AggregateInputData &aggr_input_data, const WindowPartitionInput &partition) {
		// TODO: Two pass parallel sorting using Build
		auto &inputs = *partition.inputs;
		ColumnDataScanState scan;
		DataChunk sort;
		inputs.InitializeScan(scan, partition.column_ids);
		inputs.InitializeScanChunk(scan, sort);

		// Sort on the single argument
		auto &bind_data = aggr_input_data.bind_data->Cast<QuantileBindData>();
		auto order_expr = make_uniq<BoundConstantExpression>(Value(sort.GetTypes()[0]));
		auto order_type = bind_data.desc ? OrderType::DESCENDING : OrderType::ASCENDING;
		BoundOrderModifier order_bys;
		order_bys.orders.emplace_back(BoundOrderByNode(order_type, OrderByNullType::NULLS_LAST, std::move(order_expr)));
		vector<column_t> sort_idx(1, 0);
		const auto count = partition.count;

		index_tree = make_uniq<WindowIndexTree>(partition.context, order_bys, sort_idx, count);
		auto index_state = index_tree->GetLocalState();
		auto &local_state = index_state->Cast<WindowIndexTreeLocalState>();

		//	Build the indirection array by scanning the valid indices
		const auto &filter_mask = partition.filter_mask;
		SelectionVector filter_sel(STANDARD_VECTOR_SIZE);
		while (inputs.Scan(scan, sort)) {
			const auto row_idx = scan.current_row_index;
			if (!filter_mask.AllValid() || !partition.all_valid[0]) {
				auto &key = sort.data[0];
				auto &validity = FlatVector::Validity(key);
				idx_t filtered = 0;
				for (sel_t i = 0; i < sort.size(); ++i) {
					if (filter_mask.RowIsValid(i + row_idx) && validity.RowIsValid(i)) {
						filter_sel[filtered++] = i;
					}
				}
				local_state.SinkChunk(sort, row_idx, filter_sel, filtered);
			} else {
				local_state.SinkChunk(sort, row_idx, nullptr, 0);
			}
		}
		local_state.Sort();
	}